

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O1

void __thiscall ft::deque<int,_ft::allocator<int>_>::clear(deque<int,_ft::allocator<int>_> *this)

{
  size_type sVar1;
  pointer pvVar2;
  pointer pvVar3;
  map_pointer ppvVar4;
  map_pointer ppvVar5;
  pointer pvVar6;
  
  sVar1 = this->m_size;
  if (sVar1 != 0) {
    pvVar3 = (this->m_finish).m_cur;
    pvVar2 = (this->m_finish).m_first;
    ppvVar4 = (this->m_finish).m_node;
    do {
      ppvVar5 = ppvVar4;
      if (pvVar3 == pvVar2) {
        ppvVar5 = ppvVar4 + -1;
        (this->m_finish).m_node = ppvVar5;
        pvVar2 = ppvVar4[-1];
        (this->m_finish).m_first = pvVar2;
        pvVar3 = pvVar2 + 0x40;
        (this->m_finish).m_last = pvVar3;
        (this->m_finish).m_cur = pvVar3;
      }
      pvVar3 = pvVar3 + -1;
      (this->m_finish).m_cur = pvVar3;
      sVar1 = sVar1 - 1;
      ppvVar4 = ppvVar5;
    } while (sVar1 != 0);
    this->m_size = 0;
  }
  pvVar3 = (this->m_start).m_cur;
  pvVar2 = (this->m_finish).m_cur;
  if (pvVar3 != pvVar2) {
    pvVar6 = (this->m_start).m_last;
    sVar1 = this->m_size;
    ppvVar4 = (this->m_start).m_node;
    do {
      pvVar3 = pvVar3 + 1;
      (this->m_start).m_cur = pvVar3;
      ppvVar5 = ppvVar4;
      if (pvVar3 == pvVar6) {
        ppvVar5 = ppvVar4 + 1;
        (this->m_start).m_node = ppvVar5;
        pvVar3 = ppvVar4[1];
        (this->m_start).m_first = pvVar3;
        pvVar6 = pvVar3 + 0x40;
        (this->m_start).m_last = pvVar6;
        (this->m_start).m_cur = pvVar3;
      }
      sVar1 = sVar1 - 1;
      ppvVar4 = ppvVar5;
    } while (pvVar3 != pvVar2);
    this->m_size = sVar1;
  }
  return;
}

Assistant:

void clear() {
		size_type n = this->size();
		while (n > this->size() / 2) {
			this->pop_back();
			--n;
		}

		while (this->begin() != this->end())
			this->pop_front();
	}